

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall llvm::detail::IEEEFloat::modSpecials(IEEEFloat *this,IEEEFloat *rhs)

{
  IEEEFloat *rhs_local;
  IEEEFloat *this_local;
  
  switch((rhs->field_0x12 & 7) + (this->field_0x12 & 7) * '\x04') {
  case 0:
  case 2:
  case 3:
  case 0xb:
  case 0xf:
    makeNaN(this,false,false,(APInt *)0x0);
    this_local._4_4_ = opInvalidOp;
    break;
  case 1:
  case 9:
  case 0xd:
    this->field_0x12 = this->field_0x12 & 0xf7;
    this->field_0x12 = this->field_0x12 & 0xf8 | 1;
    copySignificand(this,rhs);
    this_local._4_4_ = opOK;
    break;
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 0xc:
  case 0xe:
    this_local._4_4_ = opOK;
    break;
  case 10:
    this_local._4_4_ = opOK;
    break;
  default:
    llvm_unreachable_internal
              ((char *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
               ,0x638);
  }
  return this_local._4_4_;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::modSpecials(const IEEEFloat &rhs) {
  switch (PackCategoriesIntoKey(category, rhs.category)) {
  default:
    llvm_unreachable(nullptr);

  case PackCategoriesIntoKey(fcNaN, fcZero):
  case PackCategoriesIntoKey(fcNaN, fcNormal):
  case PackCategoriesIntoKey(fcNaN, fcInfinity):
  case PackCategoriesIntoKey(fcNaN, fcNaN):
  case PackCategoriesIntoKey(fcZero, fcInfinity):
  case PackCategoriesIntoKey(fcZero, fcNormal):
  case PackCategoriesIntoKey(fcNormal, fcInfinity):
    return opOK;

  case PackCategoriesIntoKey(fcZero, fcNaN):
  case PackCategoriesIntoKey(fcNormal, fcNaN):
  case PackCategoriesIntoKey(fcInfinity, fcNaN):
    sign = false;
    category = fcNaN;
    copySignificand(rhs);
    return opOK;

  case PackCategoriesIntoKey(fcNormal, fcZero):
  case PackCategoriesIntoKey(fcInfinity, fcZero):
  case PackCategoriesIntoKey(fcInfinity, fcNormal):
  case PackCategoriesIntoKey(fcInfinity, fcInfinity):
  case PackCategoriesIntoKey(fcZero, fcZero):
    makeNaN();
    return opInvalidOp;

  case PackCategoriesIntoKey(fcNormal, fcNormal):
    return opOK;
  }
}